

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O2

void tf::detail::
     insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *begin,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *end)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long lVar3;
  T tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (begin != end) {
    lVar3 = 0;
    __rhs = begin;
    while (__lhs = __rhs + 1, __lhs != end) {
      bVar1 = std::operator<(__lhs,__rhs);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
        lVar2 = lVar3;
        do {
          std::__cxx11::string::operator=((string *)(__rhs + 1),(string *)__rhs);
          this = begin;
          if (lVar2 == 0) break;
          bVar1 = std::operator<(&local_50,__rhs + -1);
          lVar2 = lVar2 + 0x20;
          this = __rhs;
          __rhs = __rhs + -1;
        } while (bVar1);
        std::__cxx11::string::operator=((string *)this,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      lVar3 = lVar3 + -0x20;
      __rhs = __lhs;
    }
  }
  return;
}

Assistant:

void insertion_sort(RandItr begin, RandItr end, Compare comp) {

  using T = typename std::iterator_traits<RandItr>::value_type;

  if (begin == end) {
    return;
  }

  for (RandItr cur = begin + 1; cur != end; ++cur) {

    RandItr shift = cur;
    RandItr shift_1 = cur - 1;

    // Compare first to avoid 2 moves for an element
    // already positioned correctly.
    if (comp(*shift, *shift_1)) {
      T tmp = std::move(*shift);
      do {
        *shift-- = std::move(*shift_1);
      }while (shift != begin && comp(tmp, *--shift_1));
      *shift = std::move(tmp);
    }
  }
}